

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void chaiscript::Module::
     apply<chaiscript::detail::Dispatch_Engine,__gnu_cxx::__normal_iterator<std::pair<chaiscript::Type_Info,std::__cxx11::string>const*,std::vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>>>
               (__normal_iterator<const_std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                begin,__normal_iterator<const_std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      end,Dispatch_Engine *t)

{
  Dispatch_Engine *t_local;
  __normal_iterator<const_std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  end_local;
  __normal_iterator<const_std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  begin_local;
  
  std::
  for_each<__gnu_cxx::__normal_iterator<std::pair<chaiscript::Type_Info,std::__cxx11::string>const*,std::vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>>,chaiscript::Module::apply<chaiscript::detail::Dispatch_Engine,__gnu_cxx::__normal_iterator<std::pair<chaiscript::Type_Info,std::__cxx11::string>const*,std::vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>>>(__gnu_cxx::__normal_iterator<std::pair<chaiscript::Type_Info,std::__cxx11::string>const*,std::vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>>,__gnu_cxx::__normal_iterator<std::pair<chaiscript::Type_Info,std::__cxx11::string>const*,std::vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>>,chaiscript::detail::Dispatch_Engine&)::_lambda(auto:1_const&)_1_>
            (begin,end,(anon_class_8_1_54a39814)t);
  return;
}

Assistant:

static void apply(InItr begin, const InItr end, T &t) {
      for_each(begin, end, [&t](const auto &obj) {
        try {
          t.add(obj.first, obj.second);
        } catch (const chaiscript::exception::name_conflict_error &) {
          /// \todo Should we throw an error if there's a name conflict
          ///       while applying a module?
        }
      });
    }